

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O0

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::Dump
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this)

{
  bool bVar1;
  uint index_00;
  uint uVar2;
  uint local;
  uint index;
  uint j;
  uint i;
  bool printed;
  SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this_local;
  
  bVar1 = false;
  Output::Print(L"[");
  for (index = 0; index < this->maxIndex >> 4; index = index + 1) {
    if (this->backingStore[index] != (uint *)0x0) {
      for (local = 0; local < 0x10; local = local + 1) {
        index_00 = index * 0x10 + local;
        uVar2 = SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<false,true>
                          ((SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *)this,
                           index_00);
        if (index_00 != uVar2) {
          if (bVar1) {
            Output::Print(L", ");
          }
          Output::Print(L"%u <= %u",(ulong)uVar2,(ulong)index_00);
          bVar1 = true;
        }
      }
    }
  }
  Output::Print(L"]\n");
  return;
}

Assistant:

void Dump()
    {
        bool printed = false;
        Output::Print(_u("["));
        for (indexType i = 0; i < maxIndex / numPerSegment; i++)
        {
            if (backingStore[i] == nullptr)
            {
                continue;
            }
            for (indexType j = 0; j < numPerSegment; j++)
            {
                indexType index = i * numPerSegment + j;
                indexType local = Lookup<false, true>(index);
                if (index != local)
                {
                    if (printed)
                    {
                        Output::Print(_u(", "));
                    }
                    Output::Print(_u("%u <= %u"), local, index);
                    printed = true;
                }
            }
        }
        Output::Print(_u("]\n"));
    }